

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basewindow_x11.cc
# Opt level: O2

void __thiscall bgui::BaseWindow::getContent(BaseWindow *this,ImageU8 *image)

{
  int iVar1;
  XImage *pXVar2;
  char *pcVar3;
  int iVar4;
  uint uVar5;
  BaseWindowData *pBVar6;
  long lVar7;
  long lVar8;
  int grs;
  int rrs;
  int rls;
  int brs;
  int bls;
  int gls;
  
  pBVar6 = this->p;
  pXVar2 = pBVar6->image;
  anon_unknown_0::getShiftFromMask(pXVar2->red_mask,&rls,&rrs);
  anon_unknown_0::getShiftFromMask(pXVar2->green_mask,&gls,&grs);
  anon_unknown_0::getShiftFromMask(pXVar2->blue_mask,&bls,&brs);
  pthread_mutex_lock((pthread_mutex_t *)&pBVar6->mutex);
  gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
            (image,(long)this->p->w,(long)this->p->h,3);
  pBVar6 = this->p;
  for (lVar7 = 0; lVar7 < pBVar6->h; lVar7 = lVar7 + 1) {
    iVar4 = pBVar6->image->bytes_per_line * (int)lVar7;
    pcVar3 = pBVar6->image->data;
    for (lVar8 = 0; lVar8 < pBVar6->w; lVar8 = lVar8 + 1) {
      iVar1 = pBVar6->image->bitmap_unit;
      if (iVar1 == 0x20) {
        uVar5 = *(uint *)(pcVar3 + lVar8 * 4 + (long)iVar4);
      }
      else if (iVar1 == 0x10) {
        uVar5 = (uint)*(ushort *)(pcVar3 + lVar8 * 2 + (long)iVar4);
      }
      else {
        uVar5 = 0;
        if (iVar1 == 8) {
          uVar5 = (uint)(byte)pcVar3[lVar8 + iVar4];
        }
      }
      (*image->img)[lVar7][lVar8] =
           (uchar)(((ulong)((uint)pBVar6->image->red_mask & uVar5) << ((byte)rrs & 0x3f)) >>
                  ((byte)rls & 0x3f));
      image->img[1][lVar7][lVar8] =
           (uchar)(((ulong)((uint)this->p->image->green_mask & uVar5) << ((byte)grs & 0x3f)) >>
                  ((byte)gls & 0x3f));
      image->img[2][lVar7][lVar8] =
           (uchar)(((ulong)(uVar5 & (uint)this->p->image->blue_mask) << ((byte)brs & 0x3f)) >>
                  ((byte)bls & 0x3f));
      pBVar6 = this->p;
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&pBVar6->mutex);
  return;
}

Assistant:

void BaseWindow::getContent(gimage::ImageU8 &image)
{
  int rls, rrs;
  int gls, grs;
  int bls, brs;

  // store image in buffer

  getShiftFromMask(p->image->red_mask, rls, rrs);
  getShiftFromMask(p->image->green_mask, gls, grs);
  getShiftFromMask(p->image->blue_mask, bls, brs);

  pthread_mutex_lock(&(p->mutex));

  image.setSize(p->w, p->h, 3);

  for (int k=0; k<p->h; k++)
  {
    char *line=p->image->data+k*p->image->bytes_per_line;

    for (int i=0; i<p->w; i++)
    {
      uint32_t v=0;

      switch (p->image->bitmap_unit)
      {
        case 8:
          v=reinterpret_cast<uint8_t *>(line)[i];
          break;

        case 16:
          v=reinterpret_cast<uint16_t *>(line)[i];
          break;

        case 32:
          v=reinterpret_cast<uint32_t *>(line)[i];
          break;
      }

      image.set(i, k, 0, inverseShiftAndMaskValue(v, rls, rrs, p->image->red_mask));
      image.set(i, k, 1, inverseShiftAndMaskValue(v, gls, grs, p->image->green_mask));
      image.set(i, k, 2, inverseShiftAndMaskValue(v, bls, brs, p->image->blue_mask));
    }
  }

  pthread_mutex_unlock(&(p->mutex));
}